

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlParseInternalSubset(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  int iVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  unsigned_long uVar5;
  xmlChar *check;
  
  if (*ctxt->input->cur == '[') {
    iVar2 = ctxt->inputNr;
    ctxt->instate = XML_PARSER_DTD;
    ctxt->curly = 1;
    xmlNextChar(ctxt);
    while( true ) {
      pxVar3 = ctxt->input->cur;
      if (((*pxVar3 == ']') && (ctxt->inputNr <= iVar2)) || (ctxt->instate == XML_PARSER_EOF))
      break;
      uVar5 = ctxt->input->consumed;
      xmlSkipBlankChars(ctxt);
      xmlParseMarkupDecl(ctxt);
      switchD_0015a263::default(ctxt);
      if (((1 < ctxt->inputNr) && (ctxt->input->filename != (char *)0x0)) &&
         ((pxVar4 = ctxt->input->cur, *pxVar4 == '<' && ((pxVar4[1] == '!' && (pxVar4[2] == '[')))))
         ) {
        xmlParseConditionalSections(ctxt);
      }
      if ((ctxt->input->cur == pxVar3) && ((ulong)(uint)uVar5 == ctxt->input->consumed)) {
        xmlFatalErr(ctxt,XML_ERR_INTERNAL_ERROR,
                    "xmlParseInternalSubset: error detected in Markup declaration\n");
        if (ctxt->inputNr <= iVar2) break;
        xmlPopInput(ctxt);
      }
    }
    if (*ctxt->input->cur == ']') {
      ctxt->curly = 0;
      xmlNextChar(ctxt);
      xmlSkipBlankChars(ctxt);
    }
  }
  if (ctxt->mlType == XML_TYPE_SML) {
    xVar1 = *ctxt->input->cur;
    if ((xVar1 == '\n') || (xVar1 == ';')) {
LAB_0016849a:
      xmlNextChar(ctxt);
      return;
    }
  }
  else if ((ctxt->mlType == XML_TYPE_XML) && (*ctxt->input->cur == '>')) goto LAB_0016849a;
  xmlFatalErr(ctxt,XML_ERR_DOCTYPE_NOT_FINISHED,(char *)0x0);
  return;
}

Assistant:

static void
xmlParseInternalSubset(xmlParserCtxtPtr ctxt) {

    DEBUG_ENTER(("xmlParseInternalSubset(%s);\n", dbgCtxt(ctxt)));

    /*
     * Is there any DTD definition ?
     */
    if (RAW == '[') {
        int baseInputNr = ctxt->inputNr;
        ctxt->instate = XML_PARSER_DTD;
        ctxt->curly = 1;
        NEXT;
	/*
	 * Parse the succession of Markup declarations and
	 * PEReferences.
	 * Subsequence (markupdecl | PEReference | S)*
	 */
	while (((RAW != ']') || (ctxt->inputNr > baseInputNr)) &&
               (ctxt->instate != XML_PARSER_EOF)) {
	    const xmlChar *check = CUR_PTR;
	    unsigned int cons = ctxt->input->consumed;

	    SKIP_BLANKS;
	    xmlParseMarkupDecl(ctxt);
	    xmlParsePEReference(ctxt);

            /*
             * Conditional sections are allowed from external entities included
             * by PE References in the internal subset.
             */
            if ((ctxt->inputNr > 1) && (ctxt->input->filename != NULL) &&
                (RAW == '<') && (NXT(1) == '!') && (NXT(2) == '[')) {
                xmlParseConditionalSections(ctxt);
            }

	    if ((CUR_PTR == check) && (cons == ctxt->input->consumed)) {
		xmlFatalErr(ctxt, XML_ERR_INTERNAL_ERROR,
	     "xmlParseInternalSubset: error detected in Markup declaration\n");
                if (ctxt->inputNr > baseInputNr)
                    xmlPopInput(ctxt);
                else
		    break;
	    }
	}
	if (RAW == ']') {
	    ctxt->curly = 0;
	    NEXT;
	    SKIP_BLANKS;
	}
    }

    /*
     * We should be at the end of the DOCTYPE declaration.
     */
    if (!RAW_IS_GT_MLI) { /* RAW != '>' */
	xmlFatalErr(ctxt, XML_ERR_DOCTYPE_NOT_FINISHED, NULL);
	RETURN();
    }
    NEXT;
    RETURN();
}